

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::compress(SurfaceMesh *this)

{
  if (this->isCompressedFlag == false) {
    compressHalfedges(this);
    compressEdges(this);
    compressFaces(this);
    compressVertices(this);
    this->isCompressedFlag = true;
  }
  return;
}

Assistant:

void SurfaceMesh::compress() {
  if (isCompressed()) {
    return;
  }

  compressHalfedges();
  compressEdges();
  compressFaces();
  compressVertices();
  isCompressedFlag = true;
}